

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

Term * Kernel::Term::create(uint function,uint arity,TermList *args)

{
  anon_class_24_3_c9ea936b create;
  anon_class_24_3_e455b5ad isCorrectVal;
  bool bVar1;
  Term **ppTVar2;
  Term *shared;
  bool created;
  anon_class_24_3_c9ea936b allocTerm;
  bool share;
  Term *in_stack_00000228;
  TermSharing *in_stack_00000230;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *in_stack_ffffffffffffff30;
  anon_class_8_1_89897ddb in_stack_ffffffffffffff38;
  bool *inserted;
  undefined8 in_stack_ffffffffffffff78;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff80;
  anon_class_8_1_8991fb9c getArg;
  anon_class_24_3_c9ea936b *this;
  TermList **ppTVar3;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar4;
  anon_class_8_1_8991fb9c aVar5;
  TermList *local_18;
  undefined1 local_10 [8];
  Term *local_8;
  
  Lib::$_0::operator()
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint)in_stack_ffffffffffffff78);
  bVar1 = Lib::IterTraits<Lib::RangeIterator<unsigned_int>>::
          all<Kernel::Term::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__0>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  getArg.this = (Literal *)local_10;
  this = (anon_class_24_3_c9ea936b *)(local_10 + 4);
  ppTVar3 = &local_18;
  if (bVar1) {
    bVar4 = 0;
    inserted = DAT_01333838;
    aVar5.this = getArg.this;
    termHash<Kernel::Term::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__3>
              ((uint)((ulong)&local_18 >> 0x20),getArg,(uint)&local_18);
    create.function = (uint *)this;
    create.arity = (uint *)getArg.this;
    create.args = ppTVar3;
    isCorrectVal.arity._0_7_ = in_stack_ffffffffffffffa0;
    isCorrectVal.function = (uint *)in_stack_ffffffffffffff98;
    isCorrectVal.arity._7_1_ = bVar4;
    isCorrectVal.args = (TermList **)aVar5.this;
    ppTVar2 = Lib::Set<Kernel::Term*,Indexing::TermSharing>::
              rawFindOrInsert<Kernel::Term::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__1,Kernel::Term::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__2>
                        ((Set<Kernel::Term_*,_Indexing::TermSharing> *)local_10,create,
                         (uint)((ulong)(local_10 + 4) >> 0x20),isCorrectVal,inserted);
    local_8 = *ppTVar2;
    if ((bVar4 & 1) != 0) {
      Indexing::TermSharing::computeAndSetSharedTermData(in_stack_00000230,in_stack_00000228);
    }
  }
  else {
    local_8 = Term::create::anon_class_24_3_c9ea936b::operator()(this);
  }
  return local_8;
}

Assistant:

Term* Term::create(unsigned function, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->functionArity(function), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    Term* s = new(arity) Term;
    s->makeSymbol(function,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_terms.rawFindOrInsert(allocTerm,
        Term::termHash(function, [&](auto i){ return args[i]; }, arity),
        [&](Term* t) { return t->functor() == function && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created);
    if (created) {
      env.sharing->computeAndSetSharedTermData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}